

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O1

Keylet * jbcoin::keylet::payChan
                   (Keylet *__return_storage_ptr__,AccountID *source,AccountID *dst,uint32_t seq)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  sha512_half_hasher h;
  undefined4 local_104;
  SHA512_CTX local_100;
  
  SHA512_Init(&local_100);
  local_104 = CONCAT22(local_104._2_2_,0x7800);
  SHA512_Update(&local_100,&local_104,2);
  SHA512_Update(&local_100,source,0x14);
  SHA512_Update(&local_100,dst,0x14);
  puVar2 = (undefined1 *)((long)&local_104 + 3);
  local_104 = seq;
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)local_100.h + lVar3 + -4);
    *(undefined1 *)((long)local_100.h + lVar3 + -4) = *puVar2;
    *puVar2 = uVar1;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + -1;
  } while (lVar3 == 1);
  SHA512_Update(&local_100,&local_104,4);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (&__return_storage_ptr__->key,(basic_sha512_half_hasher *)&local_100);
  __return_storage_ptr__->type = ltPAYCHAN;
  return __return_storage_ptr__;
}

Assistant:

Keylet
payChan (AccountID const& source, AccountID const& dst, std::uint32_t seq)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, std::uint16_t(spaceXRPUChannel));
    hash_append(h, source);
    hash_append(h, dst);
    hash_append(h, seq);
    return { ltPAYCHAN, static_cast<uint256>(h) };
}